

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxcox.c
# Opt level: O3

double boxcox_loglik(double lambda,void *params)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double *vec;
  ulong uVar4;
  uint N;
  double local_58;
  
  N = (uint)*params;
  vec = (double *)malloc((long)(int)N * 8);
  if ((int)N < 1) {
    local_58 = 0.0;
  }
  else {
    local_58 = 0.0;
    uVar4 = 0;
    do {
      uVar1 = uVar4 + 1;
      dVar2 = log(*(double *)((long)params + uVar4 * 8 + 8));
      vec[uVar4] = dVar2;
      local_58 = local_58 + dVar2;
      uVar4 = uVar1;
    } while (N != uVar1);
    if (lambda != 0.0 && 0 < (int)N) {
      uVar4 = 0;
      do {
        uVar1 = uVar4 + 1;
        dVar2 = pow(*(double *)((long)params + uVar4 * 8 + 8),lambda);
        vec[uVar4] = dVar2 / lambda;
        uVar4 = uVar1;
      } while (N != uVar1);
    }
  }
  dVar3 = var(vec,N);
  dVar2 = *params;
  dVar3 = log(dVar3);
  free(vec);
  return -(dVar3 * dVar2 * -0.5 + (lambda + -1.0) * local_58);
}

Assistant:

double boxcox_loglik(double lambda, void *params) {
    double loglik,variance,sum;
    int N,i;
    double *tdata;
    double *xpar = (double*) params;

    N = (int) xpar[0];
    tdata = (double*) malloc(sizeof(double) *N);

    sum = 0.0;
    for(i = 0; i < N;++i) {
        tdata[i] = log(xpar[i+1]);
        sum += tdata[i];
    }

    if (lambda == 0) {
        variance = var(tdata,N);
    } else {
        for(i = 0; i < N;++i) {
            tdata[i] = pow(xpar[i+1],lambda) / lambda;
        }
        variance = var(tdata,N);
    }

    loglik = (lambda-1)*sum - (xpar[0]/2.0)*log(variance);

    free(tdata);
    return -loglik;
}